

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O2

bool __thiscall Xml::Private::parseElement(Private *this,Element *element)

{
  Position *pPVar1;
  Type TVar2;
  String *other;
  bool bVar3;
  Variant *this_00;
  Element *element_00;
  String *pSVar4;
  String attributeName;
  Position pos;
  String local_c0;
  String local_98;
  Position *local_70;
  Position *local_68;
  String *local_60;
  String local_58;
  
  element->line = (this->token).pos.line;
  element->column = (*(int *)&(this->token).pos.pos - *(int *)&(this->token).pos.lineStart) + 1;
  bVar3 = readToken(this);
  if (bVar3) {
    pPVar1 = &(this->token).pos;
    if ((this->token).type == nameType) {
      pSVar4 = &(this->token).value;
      local_60 = &element->type;
      String::operator=(local_60,pSVar4);
LAB_00107519:
      do {
        bVar3 = readToken(this);
        if (!bVar3) {
          return bVar3;
        }
        TVar2 = (this->token).type;
        if (TVar2 == nameType) {
          String::String(&local_c0,pSVar4);
          bVar3 = readToken(this);
          if (!bVar3) goto LAB_001075c3;
          if ((this->token).type == equalsSignType) {
            bVar3 = readToken(this);
            if (!bVar3) goto LAB_001075c3;
            if ((this->token).type == stringType) {
              HashMap<String,_String>::append(&element->attributes,&local_c0,pSVar4);
              String::~String(&local_c0);
              goto LAB_00107519;
            }
            local_98.data = &local_98._data;
            local_98._data.ref = 0;
            local_98._data.str = "Expected string";
            local_98._data.len = 0xf;
            syntaxError(this,pPVar1,&local_98);
          }
          else {
            local_98.data = &local_98._data;
            local_98._data.ref = 0;
            local_98._data.str = "Expected \'=\'";
            local_98._data.len = 0xc;
            syntaxError(this,pPVar1,&local_98);
          }
          String::~String(&local_98);
          goto LAB_001075c3;
        }
        if (TVar2 == emptyTagEndType) {
          return bVar3;
        }
      } while (TVar2 != tagEndType);
      local_68 = &this->pos;
      local_70 = pPVar1;
      do {
        pPVar1 = local_70;
        local_98._data.len = (usize)local_68->lineStart;
        local_98.data = *(Data **)local_68;
        local_98._data.str = local_68->pos;
        bVar3 = readToken(this);
        if (bVar3) {
          TVar2 = (this->token).type;
          if (TVar2 != startTagBeginType) {
            if (TVar2 != endTagBeginType) {
              local_68->lineStart = (char *)local_98._data.len;
              *(Data **)local_68 = local_98.data;
              local_68->pos = local_98._data.str;
              goto LAB_00107642;
            }
            bVar3 = readToken(this);
            other = local_60;
            if (!bVar3) {
              return false;
            }
            if ((this->token).type != nameType) {
              local_c0.data = &local_c0._data;
              local_c0._data.ref = 0;
              local_c0._data.str = "Expected tag name";
              local_c0._data.len = 0x11;
              syntaxError(this,pPVar1,&local_c0);
              goto LAB_001075c3;
            }
            bVar3 = String::operator!=(pSVar4,local_60);
            if (bVar3) {
              local_58.data = &local_58._data;
              local_58._data.ref = 0;
              local_58._data.str = "Expected end tag of \'";
              local_58._data.len = 0x15;
              String::operator+(&local_98,&local_58,other);
              String::operator+(&local_c0,&local_98,(char (*) [2])0x10b89a);
              syntaxError(this,pPVar1,&local_c0);
              String::~String(&local_c0);
              String::~String(&local_98);
              pSVar4 = &local_58;
              goto LAB_001075c8;
            }
            bVar3 = readToken(this);
            if (!bVar3) {
              return false;
            }
            if ((this->token).type == tagEndType) {
              return true;
            }
            local_c0.data = &local_c0._data;
            local_c0._data.ref = 0;
            local_c0._data.str = "Expected \'>\'";
            local_c0._data.len = 0xc;
            syntaxError(this,pPVar1,&local_c0);
            goto LAB_001075c3;
          }
          local_c0.data = (Data *)&Variant::nullData;
          this_00 = List<Xml::Variant>::append(&element->content,(Variant *)&local_c0);
          Variant::clear((Variant *)&local_c0);
          element_00 = Variant::toElement(this_00);
          bVar3 = parseElement(this,element_00);
        }
        else {
LAB_00107642:
          local_c0.data = &String::emptyData.super_Data;
          bVar3 = parseText(this,&local_c0);
          if (!bVar3) goto LAB_001075c3;
          Variant::Variant((Variant *)&local_58,&local_c0);
          List<Xml::Variant>::append(&element->content,(Variant *)&local_58);
          Variant::clear((Variant *)&local_58);
          String::~String(&local_c0);
        }
        if (bVar3 == false) {
          return false;
        }
      } while( true );
    }
    local_c0.data = &local_c0._data;
    local_c0._data.ref = 0;
    local_c0._data.str = "Expected tag name";
    local_c0._data.len = 0x11;
    syntaxError(this,pPVar1,&local_c0);
LAB_001075c3:
    pSVar4 = &local_c0;
LAB_001075c8:
    String::~String(pSVar4);
  }
  return false;
}

Assistant:

bool Xml::Private::parseElement(Element& element)
{
  element.line = token.pos.line;
  element.column = (int)(token.pos.pos - token.pos.lineStart) + 1;
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  element.type = token.value;
  for(;;)
  {
    if(!readToken())
      return false;
    if(token.type == Token::emptyTagEndType)
      return true;
    if(token.type == Token::tagEndType)
      break;
    if(token.type == Token::nameType)
    {
      String attributeName = token.value;
      if(!readToken())
        return false;
      if(token.type != Token::equalsSignType)
        return syntaxError(token.pos, "Expected '='"), false;
      if(!readToken())
        return false;
      if(token.type != Token::stringType)
        return syntaxError(token.pos, "Expected string"), false;
      element.attributes.append(attributeName, token.value);
      continue;
    }
  }
  for(;;)
  {
    Position pos = this->pos;
    if(readToken())
    {
      if(token.type == Token::endTagBeginType)
        break;
      if(token.type == Token::startTagBeginType)
      {
        Variant& variant = element.content.append(Variant());
        if(!parseElement(variant.toElement()))
          return false;
        continue;
      }
      else
        this->pos = pos;
    }
    String string;
    if(!parseText(string))
      return false;
    element.content.append(string);
  }
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  if(token.value != element.type)
    return syntaxError(token.pos, String("Expected end tag of '") + element.type + ("'")), false;
  if(!readToken())
    return false;
  if(token.type != Token::tagEndType)
    return syntaxError(token.pos, "Expected '>'"), false;
  return true;
}